

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int16_t tmp;
  undefined2 uVar10;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  
  uVar1 = *(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  bVar15 = false;
  memset(ext + 5,0,(ulong)(uVar1 + 1 >> 1));
  bVar14 = len == 0;
  if (!bVar14) {
    wVar4 = utf8_ptr::s_getch(str);
    pbVar11 = (byte *)str;
    while (((uint)wVar4 < 0x80 && (iVar6 = isspace(wVar4), iVar6 != 0))) {
      str = (char *)(pbVar11 +
                    (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3) + 1);
      len = (size_t)(pbVar11 + (len - (long)str));
      bVar14 = (byte *)len == (byte *)0x0;
      if (bVar14) goto LAB_0027014a;
      wVar4 = utf8_ptr::s_getch(str);
      pbVar11 = (byte *)str;
    }
    str = (char *)pbVar11;
    if ((bVar14) ||
       ((wVar4 = utf8_ptr::s_getch((char *)pbVar11), wVar4 != L'+' &&
        ((bVar14 || (wVar5 = utf8_ptr::s_getch((char *)pbVar11), wVar5 != L'-')))))) {
LAB_0027014a:
      bVar15 = false;
    }
    else {
      bVar15 = wVar4 != L'+';
      str = (char *)(pbVar11 +
                    (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3) + 1);
      len = (size_t)(pbVar11 + (len - (long)str));
    }
  }
  ext[4] = ext[4] & 0xfeU | bVar15;
  while ((((byte *)len != (byte *)0x0 && (wVar4 = utf8_ptr::s_getch(str), (uint)wVar4 < 0x80)) &&
         (iVar6 = isspace(wVar4), iVar6 != 0))) {
    len = (size_t)((byte *)str +
                  (len - (long)((byte *)str +
                               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*str >> 7) * 3) + 1)));
    str = (char *)((byte *)str +
                  (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
  }
  iVar6 = 0;
  uVar10 = 0;
  if ((byte *)len != (byte *)0x0) {
    uVar12 = 0;
    uVar9 = 0;
    bVar14 = false;
    do {
      wVar4 = utf8_ptr::s_getch(str);
      if ((uint)(wVar4 + L'\xffffffc6') < 0xfffffff6) {
        if (wVar4 == L'.' && uVar9 == 0) {
          bVar15 = true;
          uVar9 = 1;
        }
        else if ((wVar4 & 0xffffffdfU) == 0x45) {
          pbVar11 = (byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
          pbVar13 = (byte *)str + (len - (long)pbVar11);
          if (pbVar13 == (byte *)0x0) {
LAB_002703d6:
            bVar15 = true;
          }
          else {
            wVar4 = utf8_ptr::s_getch((char *)pbVar11);
            bVar15 = wVar4 == L'+';
            if ((!bVar15) &&
               ((pbVar13 == (byte *)0x0 ||
                (wVar4 = utf8_ptr::s_getch((char *)pbVar11), wVar4 != L'-')))) goto LAB_002703d6;
            pbVar11 = pbVar11 + (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3)
                                + 1;
            pbVar13 = (byte *)str + (len - (long)pbVar11);
          }
          str = (char *)pbVar11;
          len = (size_t)pbVar13;
          iVar3 = 0;
          while ((byte *)len != (byte *)0x0) {
            wVar4 = utf8_ptr::s_getch(str);
            if (9 < (uint)(wVar4 + L'\xffffffd0')) break;
            len = (size_t)((byte *)str +
                          (len - (long)((byte *)str +
                                       (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                              (uint)((byte)*str >> 7) * 3) + 1)));
            str = (char *)((byte *)str +
                          (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) +
                          1);
            iVar3 = wVar4 + iVar3 * 10 + -0x30;
          }
          iVar8 = -iVar3;
          if (bVar15) {
            iVar8 = iVar3;
          }
          iVar6 = iVar6 + iVar8;
          bVar15 = false;
        }
        else {
          bVar15 = false;
        }
      }
      else {
        if (wVar4 != L'0' || bVar14) {
          if (uVar12 < uVar1) {
            bVar2 = (byte)uVar12 & 1;
            ext[(uVar12 >> 1) + 5] =
                 (byte)((wVar4 & 0xfU) << (bVar2 * '\x04' ^ 4)) |
                 '\x0f' << (bVar2 << 2) & ext[(uVar12 >> 1) + 5];
            uVar12 = uVar12 + 1;
          }
          bVar14 = uVar9 == 0;
          uVar9 = (uint)!bVar14;
          uVar7 = (uint)bVar14;
          bVar14 = true;
        }
        else {
          uVar9 = (uint)(uVar9 != 0);
          uVar7 = -uVar9;
          bVar14 = false;
        }
        iVar6 = iVar6 + uVar7;
        bVar15 = true;
      }
      uVar10 = (undefined2)iVar6;
      if (!bVar15) break;
      len = (size_t)((byte *)str +
                    (len - (long)((byte *)str +
                                 (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*str >> 7) * 3) + 1)));
      str = (char *)((byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    } while ((byte *)len != (byte *)0x0);
  }
  *(undefined2 *)(ext + 2) = uVar10;
  normalize(ext);
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* initialize the exponent to zero */
    int exp = 0;

    /* presume it will be positive */
    int neg = FALSE;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* set the sign */
    set_neg(ext, neg);

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* we haven't yet found a significant digit */
    int significant = FALSE;

    /* shift the digits into the value */
    int pt = FALSE;
    for (size_t idx = 0 ; rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;

        /* get this character */
        ch = p.getch();

        /* check for a digit */
        if (is_digit(ch))
        {
            /* 
             *   if it's not a zero, we're definitely into the significant
             *   part of the number 
             */
            if (ch != '0')
                significant = TRUE;

            /* 
             *   if it's significant, add it to the number - skip leading
             *   zeros, since they add no information to the number 
             */
            if (significant)
            {
                /* if we're not out of precision, add the digit */
                if (idx < prec)
                {
                    /* set the next digit */
                    set_dig(ext, idx, value_of_digit(ch));

                    /* move on to the next digit position */
                    ++idx;
                }

                /* 
                 *   that's another factor of 10 if we haven't found the
                 *   decimal point (whether or not we're out of precision to
                 *   actually store the digit, count the increase in the
                 *   exponent) 
                 */
                if (!pt)
                    ++exp;
            }
            else if (pt)
            {
                /* 
                 *   we haven't yet found a significant digit, so this is a
                 *   leading zero, but we have found the decimal point - this
                 *   reduces the exponent by one 
                 */
                --exp;
            }
        }
        else if (ch == '.' && !pt)
        {
            /* 
             *   this is the decimal point - note it; from now on, we won't
             *   increase the exponent as we add digits 
             */
            pt = TRUE;
        }
        else if (ch == 'e' || ch == 'E')
        {
            int acc;
            int exp_neg = FALSE;

            /* exponent - skip the 'e' */
            p.inc(&rem);

            /* check for a sign */
            if (rem != 0 && p.getch() == '+')
            {
                /* skip the sign */
                p.inc(&rem);
            }
            else if (rem != 0 && p.getch() == '-')
            {
                /* skip it and note it */
                p.inc(&rem);
                exp_neg = TRUE;
            }

            /* parse the exponent */
            for (acc = 0 ; rem != 0 ; p.inc(&rem))
            {
                wchar_t ch;

                /* if this is a digit, add it to the exponent */
                ch = p.getch();
                if (is_digit(ch))
                {
                    /* accumulate the digit */
                    acc *= 10;
                    acc += value_of_digit(ch);
                }
                else
                {
                    /* that's it for the exponent */
                    break;
                }
            }

            /* if it's negative, apply the sign */
            if (exp_neg)
                acc = -acc;

            /* add the exponent to the one we've calculated */
            exp += acc;

            /* after the exponent, we're done with the whole number */
            break;
        }
        else
        {
            /* it looks like we've reached the end of the number */
            break;
        }
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}